

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

int xmlSetError(xmlError *err,void *ctxt,xmlNodePtr node,int domain,int code,xmlErrorLevel level,
               char *file,int line,char *str1,char *str2,char *str3,int int1,int col,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [48];
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &stack0x00000048;
  local_f8.gp_offset = 0x30;
  local_f8.fp_offset = 0x30;
  iVar1 = xmlVSetError(err,ctxt,node,domain,code,level,file,line,str1,str2,str3,int1,col,fmt,
                       &local_f8);
  return iVar1;
}

Assistant:

static int LIBXML_ATTR_FORMAT(14,15)
xmlSetError(xmlError *err,
            void *ctxt, xmlNodePtr node,
            int domain, int code, xmlErrorLevel level,
            const char *file, int line,
            const char *str1, const char *str2, const char *str3,
            int int1, int col,
            const char *fmt, ...)
{
    va_list ap;
    int res;

    va_start(ap, fmt);
    res = xmlVSetError(err, ctxt, node, domain, code, level, file, line,
                       str1, str2, str3, int1, col, fmt, ap);
    va_end(ap);

    return(res);
}